

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExtractor.cpp
# Opt level: O0

char * __thiscall llvm::DataExtractor::getCStr(DataExtractor *this,uint64_t *offset_ptr)

{
  size_t From;
  size_t sVar1;
  char *pcVar2;
  size_type pos;
  uint64_t offset;
  uint64_t *offset_ptr_local;
  DataExtractor *this_local;
  
  From = *offset_ptr;
  sVar1 = StringRef::find(&this->Data,'\0',From);
  if (sVar1 == 0xffffffffffffffff) {
    this_local = (DataExtractor *)0x0;
  }
  else {
    *offset_ptr = sVar1 + 1;
    pcVar2 = StringRef::data(&this->Data);
    this_local = (DataExtractor *)(pcVar2 + From);
  }
  return (char *)this_local;
}

Assistant:

const char *DataExtractor::getCStr(uint64_t *offset_ptr) const {
  uint64_t offset = *offset_ptr;
  StringRef::size_type pos = Data.find('\0', offset);
  if (pos != StringRef::npos) {
    *offset_ptr = pos + 1;
    return Data.data() + offset;
  }
  return nullptr;
}